

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Osc::renderSin(V2Osc *this,float *dest,int nsamples)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  
  if (0 < nsamples) {
    iVar2 = this->freq;
    bVar1 = this->ring;
    uVar3 = this->cnt;
    uVar4 = 0x3fffffff - uVar3;
    uVar5 = 0;
    do {
      uVar6 = uVar3 + 0x40000000;
      if ((int)(uVar3 + 0x40000000) < 0) {
        uVar6 = uVar4;
      }
      fVar7 = (float)(uVar6 >> 8 | 0x3f800000) * 3.1415927 + -4.712389;
      fVar8 = fVar7 * fVar7;
      fVar7 = (((fVar8 * -0.00018542 + 0.0083143) * fVar8 + -0.16666) * fVar8 + 1.0) * fVar7 *
              this->gain;
      if (bVar1 == false) {
        fVar7 = dest[uVar5] + fVar7;
      }
      else {
        fVar7 = dest[uVar5] * fVar7;
      }
      uVar3 = uVar3 + iVar2;
      dest[uVar5] = fVar7;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 - iVar2;
    } while ((uint)nsamples != uVar5);
    this->cnt = uVar3;
  }
  return;
}

Assistant:

void renderSin(float *dest, int nsamples)
    {
        COVER("Osc sin");

        // Sine is already a perfectly bandlimited waveform, so we needn't
        // worry about aliasing here.
        for (int i=0; i < nsamples; i++)
        {
            // Brace yourselves: The name is a lie! It's actually a cosine wave!
            uint32_t phase = cnt + 0x40000000; // quarter-turn (pi/2) phase offset
            cnt += freq; // step the oscillator

            // range reduce to [0,pi]
            if (phase & 0x80000000) // Symmetry: cos(x) = cos(-x)
                phase = ~phase; // V2 uses ~ not - which is slightly off but who cares

            // convert to t in [1,2)
            float t = bits2float((phase >> 8) | 0x3f800000); // 1.0f + (phase / (2^31))

            // and then to t in [-pi/2,pi/2)
            // i know the V2 ASM code says "scale/move to (-pi/4 .. pi/4)".
            // trust me, it's lying.
            t = t * fcpi - fc1p5pi;

            output(dest + i, gain * fastsin(t));
        }
    }